

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * dmrC_conditional_expression(dmr_C *C,token *token,expression **tree)

{
  ushort uVar1;
  int iVar2;
  expression *peVar3;
  token *ptVar4;
  int is_const;
  expression *expr;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  tree_local = (expression **)logical_or_expression(C,token,tree);
  if ((*tree != (expression *)0x0) && (iVar2 = dmrC_match_op((token *)tree_local,0x3f), iVar2 != 0))
  {
    peVar3 = dmrC_alloc_expression(C,((token *)tree_local)->pos,0x11);
    peVar3->op = (((token *)tree_local)->field_2).special;
    (peVar3->field_5).field_3.unop = *tree;
    *tree = peVar3;
    ptVar4 = dmrC_parse_expression(C,((token *)tree_local)->next,&(peVar3->field_5).field_6.right);
    ptVar4 = dmrC_expect_token(C,ptVar4,0x3a,"in conditional expression");
    tree_local = (expression **)
                 dmrC_conditional_expression(C,ptVar4,&(peVar3->field_5).field_10.cond_false);
    if (((peVar3->field_5).field_0.value != 0) &&
       ((peVar3->field_5).field_10.cond_false != (expression *)0x0)) {
      uVar1 = (*(ushort *)(peVar3->field_5).field_3.unop &
              *(ushort *)(peVar3->field_5).field_10.cond_false) >> 8 & 1;
      if ((peVar3->field_5).field_2.string != (string *)0x0) {
        uVar1 = *(ushort *)(peVar3->field_5).field_2.string >> 8 & uVar1;
      }
      *(ushort *)peVar3 = *(ushort *)peVar3 & 0xff | uVar1 << 8;
    }
  }
  return (token *)tree_local;
}

Assistant:

struct token *dmrC_conditional_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	token = logical_or_expression(C, token, tree);
	if (*tree && dmrC_match_op(token, '?')) {
		struct expression *expr = dmrC_alloc_expression(C, token->pos, EXPR_CONDITIONAL);
		expr->op = token->special;
		expr->left = *tree;
		*tree = expr;
		token = dmrC_parse_expression(C, token->next, &expr->cond_true);
		token = dmrC_expect_token(C, token, ':', "in conditional expression");
		token = dmrC_conditional_expression(C, token, &expr->cond_false);
		if (expr->left && expr->cond_false) {
			int is_const = expr->left->flags &
					expr->cond_false->flags &
					Int_const_expr;
			if (expr->cond_true)
				is_const &= expr->cond_true->flags;
			expr->flags = is_const;
		}
	}
	return token;
}